

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::ArrayLocatorMethod::eval
          (ConstantValue *__return_storage_ptr__,ArrayLocatorMethod *this,EvalContext *context,
          Args *args,SourceRange param_3,SystemCallInfo *callInfo)

{
  ValueSymbol *symbol;
  bool bVar1;
  reference ppEVar2;
  type *ppEVar3;
  ConstantValue *pCVar4;
  Map *this_00;
  iterator it;
  iterator end;
  Queue *this_01;
  SVQueue *cont_00;
  Variant *__v;
  vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *cont_01;
  pair<const_slang::ast::Expression_*,_const_slang::ast::ValueSymbol_*> pVar5;
  ArrayLocatorMethod *local_1b8;
  anon_class_16_2_39bd08df find;
  anon_class_40_5_248569b6 doFind_1;
  undefined1 local_170 [8];
  undefined1 local_168 [16];
  AssociativeArray *cont;
  anon_class_40_5_248569b6 doFind;
  SVQueue results;
  ConstantValue *local_b0;
  ConstantValue *iterVal;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Kuree[P]hgdb_rtl_extern_slang_source____include_slang_ast_EvalContext_h:128:13)>
  guard;
  type *iterVar;
  type *iterExpr;
  ValueSymbol *local_78;
  undefined4 local_70;
  undefined1 local_60 [8];
  ConstantValue arr;
  Args *args_local;
  EvalContext *context_local;
  ArrayLocatorMethod *this_local;
  SourceRange param_3_local;
  
  arr.value.
  super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  .
  super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  .
  super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  .
  super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  .
  super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  .
  super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ._32_8_ = args;
  ppEVar2 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
            operator[](args,0);
  Expression::eval((ConstantValue *)local_60,*ppEVar2,context);
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)local_60);
  if (bVar1) {
    pVar5 = CallExpression::SystemCallInfo::getIteratorInfo(callInfo);
    local_78 = pVar5.second;
    iterExpr = (type *)pVar5.first;
    ppEVar3 = std::get<0ul,slang::ast::Expression_const*,slang::ast::ValueSymbol_const*>
                        ((pair<const_slang::ast::Expression_*,_const_slang::ast::ValueSymbol_*> *)
                         &iterExpr);
    guard._16_8_ = std::get<1ul,slang::ast::Expression_const*,slang::ast::ValueSymbol_const*>
                             ((pair<const_slang::ast::Expression_*,_const_slang::ast::ValueSymbol_*>
                               *)&iterExpr);
    EvalContext::disableCaching
              ((ScopeGuard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Kuree[P]hgdb_rtl_extern_slang_source____include_slang_ast_EvalContext_h:128:13)>
                *)&iterVal,context);
    symbol = *(ValueSymbol **)guard._16_8_;
    slang::ConstantValue::ConstantValue((ConstantValue *)&results.maxBound,(nullptr_t)0x0);
    pCVar4 = EvalContext::createLocal(context,symbol,(ConstantValue *)&results.maxBound);
    slang::ConstantValue::~ConstantValue((ConstantValue *)&results.maxBound);
    local_b0 = pCVar4;
    SVQueue::SVQueue((SVQueue *)&doFind.results);
    bVar1 = slang::ConstantValue::isMap((ConstantValue *)local_60);
    if (bVar1) {
      cont = (AssociativeArray *)*ppEVar3;
      doFind.ie = (type)&local_b0;
      doFind.this = (ArrayLocatorMethod *)&doFind.results;
      doFind.iterVal = (ConstantValue **)context;
      doFind.context = (EvalContext *)this;
      this_00 = slang::ConstantValue::map((ConstantValue *)local_60);
      local_168._8_8_ = CopyPtr<slang::AssociativeArray>::operator*(this_00);
      if (*(int *)&(this->super_SystemSubroutine).field_0x34 == 2) {
        std::rbegin<slang::AssociativeArray>((AssociativeArray *)local_168);
        std::rend<slang::AssociativeArray>((AssociativeArray *)local_170);
        const::{lambda(auto:1,auto:2)#1}::operator()
                  (&cont,(reverse_iterator<std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
                          *)local_168,
                   (reverse_iterator<std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
                    *)local_170);
      }
      else {
        it = std::begin<slang::AssociativeArray>((AssociativeArray *)local_168._8_8_);
        end = std::end<slang::AssociativeArray>((AssociativeArray *)local_168._8_8_);
        const::{lambda(auto:1,auto:2)#1}::operator()
                  (&cont,(_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>
                          )it._M_node,
                   (_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>)
                   end._M_node);
      }
    }
    else {
      find.doFind = (anon_class_40_5_248569b6 *)*ppEVar3;
      find.this = (ArrayLocatorMethod *)&find.doFind;
      local_1b8 = this;
      bVar1 = slang::ConstantValue::isQueue((ConstantValue *)local_60);
      if (bVar1) {
        this_01 = slang::ConstantValue::queue((ConstantValue *)local_60);
        cont_00 = CopyPtr<slang::SVQueue>::operator*(this_01);
        const::{lambda(auto:1&)#1}::operator()((_lambda_auto_1___1_ *)&local_1b8,cont_00);
      }
      else {
        __v = slang::ConstantValue::getVariant_abi_cxx11_((ConstantValue *)local_60);
        cont_01 = std::
                  get<std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                            (__v);
        const::{lambda(auto:1&)#1}::operator()((_lambda_auto_1___1_ *)&local_1b8,cont_01);
      }
    }
    slang::ConstantValue::ConstantValue(__return_storage_ptr__,(SVQueue *)&doFind.results);
    local_70 = 1;
    SVQueue::~SVQueue((SVQueue *)&doFind.results);
    ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/EvalContext.h:128:13)>
    ::~ScopeGuard((ScopeGuard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Kuree[P]hgdb_rtl_extern_slang_source____include_slang_ast_EvalContext_h:128:13)>
                   *)&iterVal);
  }
  else {
    slang::ConstantValue::ConstantValue(__return_storage_ptr__,(nullptr_t)0x0);
    local_70 = 1;
  }
  slang::ConstantValue::~ConstantValue((ConstantValue *)local_60);
  return __return_storage_ptr__;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo& callInfo) const final {
        ConstantValue arr = args[0]->eval(context);
        if (!arr)
            return nullptr;

        auto [iterExpr, iterVar] = callInfo.getIteratorInfo();
        auto guard = context.disableCaching();
        auto iterVal = context.createLocal(iterVar);

        SVQueue results;
        if (arr.isMap()) {
            auto doFind = [&, ie = iterExpr](auto it, auto end) {
                for (; it != end; it++) {
                    *iterVal = it->second;
                    ConstantValue cv = ie->eval(context);
                    if (cv.isTrue()) {
                        if (isIndexed)
                            results.emplace_back(it->first);
                        else
                            results.emplace_back(it->second);

                        if (mode != All)
                            break;
                    }
                }
            };

            auto& cont = *arr.map();
            if (mode == Last)
                doFind(std::rbegin(cont), std::rend(cont));
            else
                doFind(std::begin(cont), std::end(cont));
        }
        else {
            auto doFind = [&, ie = iterExpr](auto begin, auto end) {
                for (auto it = begin; it != end; it++) {
                    *iterVal = *it;
                    ConstantValue cv = ie->eval(context);
                    if (cv.isTrue()) {
                        if (isIndexed) {
                            auto dist = std::distance(begin, it);
                            if (mode == Last)
                                dist = std::distance(begin, end) - dist - 1;

                            results.emplace_back(SVInt(32, (uint64_t)dist, true));
                        }
                        else {
                            results.emplace_back(*it);
                        }

                        if (mode != All)
                            break;
                    }
                }
            };

            auto find = [&](auto& cont) {
                if (mode == Last)
                    doFind(std::rbegin(cont), std::rend(cont));
                else
                    doFind(std::begin(cont), std::end(cont));
            };

            if (arr.isQueue())
                find(*arr.queue());
            else
                find(std::get<ConstantValue::Elements>(arr.getVariant()));
        }

        return results;
    }